

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,char *string)

{
  _Head_base<0UL,_QTextStreamPrivate_*,_false> this_00;
  long lVar1;
  long lVar2;
  long lVar3;
  QUtf8StringView data;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
       super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if (((this_00._M_head_impl)->string != (QString *)0x0) ||
     ((this_00._M_head_impl)->device != (QIODevice *)0x0)) {
    if (string == (char *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar2 = -1;
      do {
        lVar3 = lVar2 + 1;
        lVar1 = lVar2 + 1;
        lVar2 = lVar3;
      } while (string[lVar1] != '\0');
    }
    data.m_size = lVar3;
    data.m_data = string;
    QTextStreamPrivate::putString(this_00._M_head_impl,data,false);
  }
  return this;
}

Assistant:

QTextStream &QTextStream::operator<<(const char *string)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putString(QUtf8StringView(string));
    return *this;
}